

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

int TVMExtTypeFree(void *handle,int type_code)

{
  ExtTypeVTable *pEVar1;
  runtime_error *_except_;
  int type_code_local;
  void *handle_local;
  
  pEVar1 = tvm::runtime::ExtTypeVTable::Get(type_code);
  (*pEVar1->destroy)(handle);
  return 0;
}

Assistant:

int TVMExtTypeFree(void *handle, int type_code) {
  API_BEGIN();
  tvm::runtime::ExtTypeVTable::Get(type_code)->destroy(handle);
  API_END();
}